

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::boolarg::test_method(boolarg *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  check_type cVar5;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 local_318 [16];
  undefined1 *local_308;
  char **local_300;
  allocator<char> local_2f1;
  assertion_result local_2f0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  pair<const_char_*,_ArgsManager::Flags> local_2b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  local_2b8.first = "-foo";
  local_2b8.second = ALLOW_ANY;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>(&local_2a8,&local_2b8);
  __l._M_len = 1;
  __l._M_array = &local_2a8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_318,__l,(allocator_type *)&local_2f0);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_318);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_318);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-foo",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xa7;
  file.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2d8,msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_330 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_338,0xa7);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0xa8;
  file_00.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_358,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_360 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_368,0xa8);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0xaa;
  file_01.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_388,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-fo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-fo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_390 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_398,0xaa);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0xab;
  file_02.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3b8,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-fo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-fo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_3c8,0xab);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0xad;
  file_03.m_begin = (iterator)&local_3d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3e8,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-fooo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-fooo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3f0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_3f8,0xad);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0xae;
  file_04.m_begin = (iterator)&local_408;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_418,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-fooo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-fooo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_420 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_428,0xae);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-foo=0",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0xb1;
  file_05.m_begin = (iterator)&local_438;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_448,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_450 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_458,0xb1);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0xb2;
  file_06.m_begin = (iterator)&local_468;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_478,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_480 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_488,0xb2);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-foo=1",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0xb5;
  file_07.m_begin = (iterator)&local_498;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4a8,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4b0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_4b8,0xb5);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0xb6;
  file_08.m_begin = (iterator)&local_4c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4d8,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_4e8,0xb6);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-nofoo",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  file_09.m_end = (iterator)0xba;
  file_09.m_begin = (iterator)&local_4f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_508,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_510 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_518,0xba);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  file_10.m_end = (iterator)0xbb;
  file_10.m_begin = (iterator)&local_528;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_538,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_540 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_548,0xbb);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-nofoo=1",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  file_11.m_end = (iterator)0xbe;
  file_11.m_begin = (iterator)&local_558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_568,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_570 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_578,0xbe);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  file_12.m_end = (iterator)0xbf;
  file_12.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_598,
             msg_12);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5a0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_5a8,0xbf);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-foo -nofoo",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  file_13.m_end = (iterator)0xc2;
  file_13.m_begin = (iterator)&local_5b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5c8,
             msg_13);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5d0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_5d8,0xc2);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  file_14.m_end = (iterator)0xc3;
  file_14.m_begin = (iterator)&local_5e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5f8,
             msg_14);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_600 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_608,0xc3);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-foo=1 -nofoo=1",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  file_15.m_end = (iterator)0xc6;
  file_15.m_begin = (iterator)&local_618;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_628,
             msg_15);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_630 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_638,0xc6);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  file_16.m_end = (iterator)0xc7;
  file_16.m_begin = (iterator)&local_648;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_658,
             msg_16);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_660 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_668,199);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-foo=0 -nofoo=0",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  file_17.m_end = (iterator)0xca;
  file_17.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_688,
             msg_17);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_690 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_698,0xca);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  file_18.m_end = (iterator)0xcb;
  file_18.m_begin = (iterator)&local_6a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6b8,
             msg_18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_6c8,0xcb);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"--foo=1",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  file_19.m_end = (iterator)0xcf;
  file_19.m_begin = (iterator)&local_6d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6e8,
             msg_19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6f0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_6f8,0xcf);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  file_20.m_end = (iterator)0xd0;
  file_20.m_begin = (iterator)&local_708;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_718,
             msg_20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_720 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_728,0xd0);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"--nofoo=1",(allocator<char> *)local_318);
  ResetArgs(&local_args,&local_2a8.first);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  file_21.m_end = (iterator)0xd3;
  file_21.m_begin = (iterator)&local_738;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_748,
             msg_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,false);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_750 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_758,0xd3);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  file_22.m_end = (iterator)0xd4;
  file_22.m_begin = (iterator)&local_768;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_778,
             msg_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"-foo",&local_2f1);
  bVar2 = ArgsManager::GetBoolArg(&local_args,&local_2a8.first,true);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_320 = "";
  local_318[8] = false;
  local_318._0_8_ = &PTR__lazy_ostream_0113a070;
  local_308 = boost::unit_test::lazy_ostream::inst;
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_780 = "";
  local_300 = &local_328;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_318,1,0,WARN,_cVar5,(size_t)&local_788,0xd4);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_2a8);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(boolarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo});
    ResetArgs(local_args, "-foo");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    BOOST_CHECK(!local_args.GetBoolArg("-fo", false));
    BOOST_CHECK(local_args.GetBoolArg("-fo", true));

    BOOST_CHECK(!local_args.GetBoolArg("-fooo", false));
    BOOST_CHECK(local_args.GetBoolArg("-fooo", true));

    ResetArgs(local_args, "-foo=0");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=1");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    // New 0.6 feature: auto-map -nosomething to !-something:
    ResetArgs(local_args, "-nofoo");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo -nofoo"); // -nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=1 -nofoo=1"); // -nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=0 -nofoo=0"); // -nofoo=0 should win
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    // New 0.6 feature: treat -- same as -:
    ResetArgs(local_args, "--foo=1");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "--nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
}